

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

bool __thiscall chaiscript::Type_Conversions::convertable_type<long_long>(Type_Conversions *this)

{
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *this_00;
  size_type sVar1;
  Type_Info local_30;
  type_info *local_18;
  type_info *type;
  Type_Conversions *this_local;
  
  type = (type_info *)this;
  user_type<long_long>();
  local_18 = Type_Info::bare_type_info(&local_30);
  this_00 = thread_cache(this);
  sVar1 = std::
          set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          ::count(this_00,&local_18);
  return sVar1 != 0;
}

Assistant:

bool convertable_type() const noexcept {
      const auto type = user_type<T>().bare_type_info();
      return thread_cache().count(type) != 0;
    }